

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.h
# Opt level: O2

RegSlot __thiscall
Js::AsmJSByteCodeGenerator::GetAndReleaseBinaryLocations<float>
          (AsmJSByteCodeGenerator *this,EmitExpressionInfo *lhs,EmitExpressionInfo *rhs)

{
  bool bVar1;
  RegSlot RVar2;
  
  bVar1 = AsmJsFunc::IsTmpLocation<float>(this->mFunction,lhs);
  if (bVar1) {
    RVar2 = (lhs->super_EmitInfoBase).location;
  }
  else {
    bVar1 = AsmJsFunc::IsTmpLocation<float>(this->mFunction,rhs);
    if (bVar1) {
      RVar2 = (rhs->super_EmitInfoBase).location;
      rhs = lhs;
    }
    else {
      RVar2 = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
      AsmJsFunc::ReleaseLocation<float>(this->mFunction,rhs);
      rhs = lhs;
    }
  }
  AsmJsFunc::ReleaseLocation<float>(this->mFunction,rhs);
  return RVar2;
}

Assistant:

RegSlot GetAndReleaseBinaryLocations( const EmitExpressionInfo* lhs, const EmitExpressionInfo* rhs )
        {
            RegSlot tmpRegToUse;
            if( mFunction->IsTmpLocation<T>( lhs ) )
            {
                tmpRegToUse = lhs->location;
                mFunction->ReleaseLocation<T>( rhs );
            }
            else if( mFunction->IsTmpLocation<T>( rhs ) )
            {
                tmpRegToUse = rhs->location;
                mFunction->ReleaseLocation<T>( lhs );
            }
            else
            {
                tmpRegToUse = mFunction->AcquireTmpRegister<T>();
                mFunction->ReleaseLocation<T>( rhs );
                mFunction->ReleaseLocation<T>( lhs );
            }
            return tmpRegToUse;
        }